

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_buf_t local_208;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar1 == -1) {
    pcVar5 = "r != -1";
    uVar4 = 0x17f;
  }
  else {
    uv_fs_req_cleanup(&fs_req);
    options.stdio = stdio;
    stdio[0].flags = UV_IGNORE;
    stdio[1].flags = UV_INHERIT_FD;
    options.stdio_count = 3;
    stdio[1].data._0_4_ = iVar1;
    stdio[2].flags = stdio[1].flags;
    stdio[2].data._0_4_ = iVar1;
    puVar3 = uv_default_loop();
    iVar2 = uv_spawn(puVar3,&process,&options);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        if (exit_cb_called == 1) {
          if (close_cb_called == 1) {
            local_208 = uv_buf_init(output,0x400);
            iVar2 = uv_fs_read((uv_loop_t *)0x0,&fs_req,iVar1,&local_208,1,0,(uv_fs_cb)0x0);
            if (iVar2 == 0x1b) {
              uv_fs_req_cleanup(&fs_req);
              iVar1 = uv_fs_close((uv_loop_t *)0x0,&fs_req,iVar1,(uv_fs_cb)0x0);
              if (iVar1 == 0) {
                uv_fs_req_cleanup(&fs_req);
                printf("output is: %s",output);
                iVar1 = bcmp("hello world\nhello errworld\n",output,0x1c);
                if (iVar1 == 0) {
                  unlink("stdout_file");
                  puVar3 = uv_default_loop();
                  close_loop(puVar3);
                  puVar3 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar3);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                  uVar4 = 0x1a4;
                }
                else {
                  pcVar5 = "strcmp(\"hello world\\nhello errworld\\n\", output) == 0";
                  uVar4 = 0x19f;
                }
              }
              else {
                pcVar5 = "r == 0";
                uVar4 = 0x19b;
              }
            }
            else {
              pcVar5 = "r == 27";
              uVar4 = 0x197;
            }
          }
          else {
            pcVar5 = "close_cb_called == 1";
            uVar4 = 0x193;
          }
        }
        else {
          pcVar5 = "exit_cb_called == 1";
          uVar4 = 0x192;
        }
      }
      else {
        pcVar5 = "r == 0";
        uVar4 = 400;
      }
    }
    else {
      pcVar5 = "r == 0";
      uVar4 = 0x18d;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 27);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\nhello errworld\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}